

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O3

int cuddLinearInPlace(DdManager *table,int x,int y)

{
  DdHalfWord *pDVar1;
  int *piVar2;
  ulong *puVar3;
  int x_00;
  DdHalfWord y_00;
  uint uVar4;
  DdHalfWord DVar5;
  DdHalfWord DVar6;
  DdSubtable *pDVar7;
  DdNode **ppDVar8;
  DdManager *pDVar9;
  long *plVar10;
  DdNode *pDVar11;
  DdNode **ppDVar12;
  DdManager *pDVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  DdNode *pDVar17;
  DdNode *pDVar18;
  DdNode *pDVar19;
  DdNode *pDVar20;
  DdNode **ppDVar21;
  byte bVar22;
  DdNode *pDVar23;
  DdNode **ppDVar24;
  DdManager *pDVar25;
  DdNode *pDVar26;
  ulong uVar27;
  DdManager *pDVar28;
  uint uVar29;
  DdNode *pDVar30;
  DdNode *pDVar31;
  
  x_00 = table->invperm[x];
  y_00 = table->invperm[y];
  iVar14 = cuddTestInteract(table,x_00,y_00);
  if (iVar14 == 0) {
    uVar29 = table->keys;
    iVar14 = table->isolated;
  }
  else {
    pDVar7 = table->subtables;
    ppDVar24 = pDVar7[x].nodelist;
    uVar29 = pDVar7[x].slots;
    iVar14 = pDVar7[x].shift;
    ppDVar8 = pDVar7[y].nodelist;
    uVar16 = pDVar7[y].keys;
    uVar4 = pDVar7[y].slots;
    iVar15 = pDVar7[y].shift;
    DVar5 = table->vars[x_00]->ref;
    DVar6 = table->vars[(int)y_00]->ref;
    uVar27 = 0;
    pDVar28 = (DdManager *)0x0;
    pDVar25 = (DdManager *)0x0;
    do {
      pDVar9 = (DdManager *)ppDVar24[uVar27];
      if (pDVar9 != table) {
        ppDVar24[uVar27] = &table->sentinel;
        pDVar13 = pDVar9;
        if (pDVar25 != (DdManager *)0x0) {
          (pDVar28->sentinel).next = (DdNode *)pDVar9;
          pDVar13 = pDVar25;
        }
        do {
          pDVar25 = pDVar13;
          pDVar28 = pDVar9;
          pDVar9 = (DdManager *)(pDVar28->sentinel).next;
          pDVar13 = pDVar25;
        } while (pDVar9 != table);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar29);
    (pDVar28->sentinel).next = (DdNode *)0x0;
    uVar29 = uVar16;
    while (pDVar25 != (DdManager *)0x0) {
      pDVar18 = (pDVar25->sentinel).type.kids.T;
      pDVar19 = pDVar18;
      pDVar20 = pDVar18;
      if (pDVar18->index == y_00) {
        pDVar20 = (pDVar18->type).kids.T;
        pDVar19 = (pDVar18->type).kids.E;
      }
      pDVar30 = (pDVar25->sentinel).type.kids.E;
      pDVar26 = (DdNode *)((ulong)pDVar30 & 0xfffffffffffffffe);
      pDVar17 = pDVar26;
      pDVar23 = pDVar26;
      if (pDVar26->index == y_00) {
        pDVar17 = (pDVar26->type).kids.T;
        pDVar23 = (pDVar26->type).kids.E;
      }
      pDVar28 = (DdManager *)(pDVar25->sentinel).next;
      pDVar31 = (DdNode *)((ulong)pDVar23 ^ 1);
      pDVar11 = (DdNode *)((ulong)pDVar17 ^ 1);
      if (((ulong)pDVar30 & 1) == 0) {
        pDVar31 = pDVar23;
        pDVar11 = pDVar17;
      }
      pDVar18->ref = pDVar18->ref - 1;
      bVar22 = (byte)iVar15;
      pDVar18 = pDVar20;
      pDVar30 = pDVar20;
      if (pDVar20 != pDVar31) {
        ppDVar12 = ppDVar8 + (int)((((uint)pDVar31 & 1) +
                                    (int)((DdNode *)((ulong)pDVar31 & 0xfffffffffffffffe))->Id * 2 +
                                   (((uint)pDVar20 & 1) +
                                   *(int *)(((ulong)pDVar20 & 0xfffffffffffffffe) + 0x20) * 2) *
                                   0xc00005) * 0x40f1f9 >> (bVar22 & 0x1f));
        do {
          ppDVar21 = ppDVar12;
          pDVar18 = *ppDVar21;
          pDVar30 = (pDVar18->type).kids.T;
          ppDVar12 = &pDVar18->next;
        } while (pDVar20 < pDVar30);
        if (pDVar20 == pDVar30) {
          pDVar17 = (pDVar18->type).kids.E;
          if (pDVar31 < pDVar17) {
            do {
              pDVar30 = pDVar18;
              pDVar18 = pDVar30->next;
              if (pDVar20 != (pDVar18->type).kids.T) {
                ppDVar21 = &pDVar30->next;
                goto LAB_007df034;
              }
              pDVar17 = (pDVar18->type).kids.E;
            } while (pDVar31 < pDVar17);
            ppDVar21 = &pDVar30->next;
          }
          pDVar30 = pDVar18;
          if (pDVar17 == pDVar31) goto LAB_007df0a5;
        }
LAB_007df034:
        pDVar18 = cuddDynamicAllocNode(table);
        if (pDVar18 == (DdNode *)0x0) goto LAB_007df39b;
        pDVar18->index = y_00;
        pDVar18->ref = 1;
        (pDVar18->type).kids.T = pDVar20;
        (pDVar18->type).kids.E = pDVar31;
        uVar29 = uVar29 + 1;
        pDVar18->next = *ppDVar21;
        *ppDVar21 = pDVar18;
        pDVar20->ref = pDVar20->ref + 1;
        pDVar30 = (DdNode *)((ulong)pDVar31 & 0xfffffffffffffffe);
      }
LAB_007df0a5:
      pDVar30->ref = pDVar30->ref + 1;
      (pDVar25->sentinel).type.kids.T = pDVar18;
      pDVar26->ref = pDVar26->ref - 1;
      if (pDVar11 == pDVar19) {
        piVar2 = (int *)(((ulong)pDVar19 & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + 1;
        pDVar20 = pDVar11;
      }
      else {
        pDVar17 = (DdNode *)((ulong)pDVar19 ^ 1);
        pDVar30 = (DdNode *)((ulong)pDVar11 & 0xfffffffffffffffe);
        if (((ulong)pDVar11 & 1) == 0) {
          pDVar17 = pDVar19;
          pDVar30 = pDVar11;
        }
        ppDVar12 = ppDVar8 + (int)((((uint)pDVar17 & 1) +
                                    (int)((DdNode *)((ulong)pDVar17 & 0xfffffffffffffffe))->Id * 2 +
                                   (((uint)pDVar30 & 1) +
                                   *(int *)(((ulong)pDVar30 & 0xfffffffffffffffe) + 0x20) * 2) *
                                   0xc00005) * 0x40f1f9 >> (bVar22 & 0x1f));
        do {
          ppDVar21 = ppDVar12;
          pDVar20 = *ppDVar21;
          pDVar19 = (pDVar20->type).kids.T;
          ppDVar12 = &pDVar20->next;
        } while (pDVar30 < pDVar19);
        if (pDVar30 == pDVar19) {
          pDVar19 = (pDVar20->type).kids.E;
          if (pDVar17 < pDVar19) {
            do {
              pDVar23 = pDVar20;
              pDVar20 = pDVar23->next;
              if (pDVar30 != (pDVar20->type).kids.T) {
                ppDVar21 = &pDVar23->next;
                goto LAB_007df16c;
              }
              pDVar19 = (pDVar20->type).kids.E;
            } while (pDVar17 < pDVar19);
            ppDVar21 = &pDVar23->next;
          }
          pDVar23 = pDVar20;
          if (pDVar19 != pDVar17) goto LAB_007df16c;
        }
        else {
LAB_007df16c:
          pDVar20 = cuddDynamicAllocNode(table);
          if (pDVar20 == (DdNode *)0x0) {
LAB_007df39b:
            fwrite("Error: cuddLinearInPlace out of memory\n",0x27,1,(FILE *)table->err);
            return 0;
          }
          pDVar20->index = y_00;
          pDVar20->ref = 1;
          (pDVar20->type).kids.T = pDVar30;
          (pDVar20->type).kids.E = pDVar17;
          uVar29 = uVar29 + 1;
          pDVar20->next = *ppDVar21;
          *ppDVar21 = pDVar20;
          pDVar30->ref = pDVar30->ref + 1;
          pDVar23 = (DdNode *)((ulong)pDVar17 & 0xfffffffffffffffe);
        }
        pDVar23->ref = pDVar23->ref + 1;
        if (((ulong)pDVar11 & 1) != 0) {
          pDVar20 = (DdNode *)((ulong)pDVar20 ^ 1);
        }
      }
      (pDVar25->sentinel).type.kids.E = pDVar20;
      ppDVar12 = ppDVar24 +
                 (int)((((uint)pDVar20 & 1) +
                        *(int *)(((ulong)pDVar20 & 0xfffffffffffffffe) + 0x20) * 2 +
                       (((uint)pDVar18 & 1) +
                       *(int *)(((ulong)pDVar18 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)iVar14 & 0x1f));
      do {
        ppDVar21 = ppDVar12;
        pDVar19 = *ppDVar21;
        pDVar30 = (pDVar19->type).kids.T;
        ppDVar12 = &pDVar19->next;
      } while (pDVar18 < pDVar30);
      if ((pDVar18 == pDVar30) && (pDVar20 < (pDVar19->type).kids.E)) {
        do {
          pDVar30 = pDVar19;
          pDVar19 = pDVar30->next;
          if (pDVar18 != (pDVar19->type).kids.T) break;
        } while (pDVar20 < (pDVar19->type).kids.E);
        ppDVar21 = &pDVar30->next;
      }
      (pDVar25->sentinel).next = pDVar19;
      *ppDVar21 = &pDVar25->sentinel;
      pDVar25 = pDVar28;
    }
    if (0 < (int)uVar4) {
      uVar27 = 0;
      do {
        ppDVar24 = ppDVar8 + uVar27;
        pDVar25 = (DdManager *)*ppDVar24;
        while (pDVar25 != table) {
          pDVar28 = (DdManager *)(pDVar25->sentinel).next;
          if ((pDVar25->sentinel).ref == 0) {
            pDVar1 = &((pDVar25->sentinel).type.kids.T)->ref;
            *pDVar1 = *pDVar1 - 1;
            piVar2 = (int *)(((ulong)(pDVar25->sentinel).type.kids.E & 0xfffffffffffffffe) + 4);
            *piVar2 = *piVar2 + -1;
            (pDVar25->sentinel).next = table->nextFree;
            table->nextFree = &pDVar25->sentinel;
            uVar29 = uVar29 - 1;
            pDVar25 = pDVar28;
          }
          else {
            *ppDVar24 = &pDVar25->sentinel;
            ppDVar24 = &(pDVar25->sentinel).next;
            pDVar25 = pDVar28;
          }
        }
        *ppDVar24 = &table->sentinel;
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar4);
    }
    iVar14 = (-(uint)(DVar6 == 1) - (uint)(DVar5 == 1)) + (uint)(table->vars[x_00]->ref == 1) +
             table->isolated + (uint)(table->vars[(int)y_00]->ref == 1);
    table->isolated = iVar14;
    table->subtables[y].keys = uVar29;
    uVar29 = (uVar29 - uVar16) + table->keys;
    table->keys = uVar29;
    iVar15 = table->size + -1 >> 6;
    if (-1 < iVar15) {
      plVar10 = table->linear;
      uVar16 = iVar15 + 1;
      uVar27 = 0;
      do {
        puVar3 = (ulong *)(plVar10 + (long)(int)(x_00 * uVar16) + uVar27);
        *puVar3 = *puVar3 ^ plVar10[(long)(int)(y_00 * uVar16) + uVar27];
        uVar27 = uVar27 + 1;
      } while (uVar16 != uVar27);
    }
  }
  return uVar29 - iVar14;
}

Assistant:

int
cuddLinearInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int    xindex, yindex;
    int    xslots, yslots;
    int    xshift, yshift;
    int    oldxkeys, oldykeys;
    int    newxkeys, newykeys;
    int    comple, newcomplement;
    int    i;
    int    posn;
    int    isolated;
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10,*newf1,*newf0;
    DdNode *g,*next,*last=NULL;
    DdNodePtr *previousP;
    DdNode *tmp;
    DdNode *sentinel = &(table->sentinel);
#ifdef DD_DEBUG
    int    count, idcheck;
#endif

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddNextHigh(table,x) == y);
    assert(table->subtables[x].keys != 0);
    assert(table->subtables[y].keys != 0);
    assert(table->subtables[x].dead == 0);
    assert(table->subtables[y].dead == 0);
#endif

    xindex = table->invperm[x];
    yindex = table->invperm[y];

    if (cuddTestInteract(table,xindex,yindex)) {
#ifdef DD_STATS
        ddTotalNumberLinearTr++;
#endif
        /* Get parameters of x subtable. */
        xlist = table->subtables[x].nodelist;
        oldxkeys = table->subtables[x].keys;
        xslots = table->subtables[x].slots;
        xshift = table->subtables[x].shift;

        /* Get parameters of y subtable. */
        ylist = table->subtables[y].nodelist;
        oldykeys = table->subtables[y].keys;
        yslots = table->subtables[y].slots;
        yshift = table->subtables[y].shift;

        newxkeys = 0;
        newykeys = oldykeys;

        /* Check whether the two projection functions involved in this
        ** swap are isolated. At the end, we'll be able to tell how many
        ** isolated projection functions are there by checking only these
        ** two functions again. This is done to eliminate the isolated
        ** projection functions from the node count.
        */
        isolated = - ((table->vars[xindex]->ref == 1) +
                     (table->vars[yindex]->ref == 1));

        /* The nodes in the x layer are put in a chain.
        ** The chain is handled as a FIFO; g points to the beginning and
        ** last points to the end.
        */
        g = NULL;
#ifdef DD_DEBUG
        last = NULL;
#endif
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            if (f == sentinel) continue;
            xlist[i] = sentinel;
            if (g == NULL) {
                g = f;
            } else {
                last->next = f;
            }
            while ((next = f->next) != sentinel) {
                f = next;
            } /* while there are elements in the collision chain */
            last = f;
        } /* for each slot of the x subtable */
#ifdef DD_DEBUG
        /* last is always assigned in the for loop because there is at
        ** least one key */
        assert(last != NULL);
#endif
        last->next = NULL;

#ifdef DD_COUNT
        table->swapSteps += oldxkeys;
#endif
        /* Take care of the x nodes that must be re-expressed.
        ** They form a linked list pointed by g.
        */
        f = g;
        while (f != NULL) {
            next = f->next;
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f1)));
#endif
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                f11 = f10 = f1;
            }
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f11)));
#endif
            f0 = cuddE(f);
            comple = Cudd_IsComplement(f0);
            f0 = Cudd_Regular(f0);
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }
            /* Decrease ref count of f1. */
            cuddSatDec(f1->ref);
            /* Create the new T child. */
            if (f11 == f00) {
                newf1 = f11;
                cuddSatInc(newf1->ref);
            } else {
                /* Check ylist for triple (yindex,f11,f00). */
                posn = ddHash(cuddF2L(f11), cuddF2L(f00), yshift);
                /* For each element newf1 in collision list ylist[posn]. */
                previousP = &(ylist[posn]);
                newf1 = *previousP;
                while (f11 < cuddT(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                while (f11 == cuddT(newf1) && f00 < cuddE(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                if (cuddT(newf1) == f11 && cuddE(newf1) == f00) {
                    cuddSatInc(newf1->ref);
                } else { /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto cuddLinearOutOfMem;
                    newf1->index = yindex; newf1->ref = 1;
                    cuddT(newf1) = f11;
                    cuddE(newf1) = f00;
                    /* Insert newf1 in the collision list ylist[posn];
                    ** increase the ref counts of f11 and f00.
                    */
                    newykeys++;
                    newf1->next = *previousP;
                    *previousP = newf1;
                    cuddSatInc(f11->ref);
                    tmp = Cudd_Regular(f00);
                    cuddSatInc(tmp->ref);
                }
            }
            cuddT(f) = newf1;
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(newf1)));
#endif

            /* Do the same for f0, keeping complement dots into account. */
            /* decrease ref count of f0 */
            tmp = Cudd_Regular(f0);
            cuddSatDec(tmp->ref);
            /* create the new E child */
            if (f01 == f10) {
                newf0 = f01;
                tmp = Cudd_Regular(newf0);
                cuddSatInc(tmp->ref);
            } else {
                /* make sure f01 is regular */
                newcomplement = Cudd_IsComplement(f01);
                if (newcomplement) {
                    f01 = Cudd_Not(f01);
                    f10 = Cudd_Not(f10);
                }
                /* Check ylist for triple (yindex,f01,f10). */
                posn = ddHash(cuddF2L(f01), cuddF2L(f10), yshift);
                /* For each element newf0 in collision list ylist[posn]. */
                previousP = &(ylist[posn]);
                newf0 = *previousP;
                while (f01 < cuddT(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                while (f01 == cuddT(newf0) && f10 < cuddE(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                if (cuddT(newf0) == f01 && cuddE(newf0) == f10) {
                    cuddSatInc(newf0->ref);
                } else { /* no match */
                    newf0 = cuddDynamicAllocNode(table);
                    if (newf0 == NULL)
                        goto cuddLinearOutOfMem;
                    newf0->index = yindex; newf0->ref = 1;
                    cuddT(newf0) = f01;
                    cuddE(newf0) = f10;
                    /* Insert newf0 in the collision list ylist[posn];
                    ** increase the ref counts of f01 and f10.
                    */
                    newykeys++;
                    newf0->next = *previousP;
                    *previousP = newf0;
                    cuddSatInc(f01->ref);
                    tmp = Cudd_Regular(f10);
                    cuddSatInc(tmp->ref);
                }
                if (newcomplement) {
                    newf0 = Cudd_Not(newf0);
                }
            }
            cuddE(f) = newf0;

            /* Re-insert the modified f in xlist.
            ** The modified f does not already exists in xlist.
            ** (Because of the uniqueness of the cofactors.)
            */
            posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), xshift);
            newxkeys++;
            previousP = &(xlist[posn]);
            tmp = *previousP;
            while (newf1 < cuddT(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            while (newf1 == cuddT(tmp) && newf0 < cuddE(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            f->next = *previousP;
            *previousP = f;
            f = next;
        } /* while f != NULL */

        /* GC the y layer. */

        /* For each node f in ylist. */
        for (i = 0; i < yslots; i++) {
            previousP = &(ylist[i]);
            f = *previousP;
            while (f != sentinel) {
                next = f->next;
                if (f->ref == 0) {
                    tmp = cuddT(f);
                    cuddSatDec(tmp->ref);
                    tmp = Cudd_Regular(cuddE(f));
                    cuddSatDec(tmp->ref);
                    cuddDeallocNode(table,f);
                    newykeys--;
                } else {
                    *previousP = f;
                    previousP = &(f->next);
                }
                f = next;
            } /* while f */
            *previousP = sentinel;
        } /* for every collision list */

#ifdef DD_DEBUG
#if 0
        (void) fprintf(table->out,"Linearly combining %d and %d\n",x,y);
#endif
        count = 0;
        idcheck = 0;
        for (i = 0; i < yslots; i++) {
            f = ylist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) yindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newykeys) {
            fprintf(table->err,"Error in finding newykeys\toldykeys = %d\tnewykeys = %d\tactual = %d\n",oldykeys,newykeys,count);
        }
        if (idcheck != 0)
            fprintf(table->err,"Error in id's of ylist\twrong id's = %d\n",idcheck);
        count = 0;
        idcheck = 0;
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) xindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newxkeys || newxkeys != oldxkeys) {
            fprintf(table->err,"Error in finding newxkeys\toldxkeys = %d \tnewxkeys = %d \tactual = %d\n",oldxkeys,newxkeys,count);
        }
        if (idcheck != 0)
            fprintf(table->err,"Error in id's of xlist\twrong id's = %d\n",idcheck);
#endif

        isolated += (table->vars[xindex]->ref == 1) +
                    (table->vars[yindex]->ref == 1);
        table->isolated += isolated;

        /* Set the appropriate fields in table. */
        table->subtables[y].keys = newykeys;

        /* Here we should update the linear combination table
        ** to record that x <- x EXNOR y. This is done by complementing
        ** the (x,y) entry of the table.
        */

        table->keys += newykeys - oldykeys;

        cuddXorLinear(table,xindex,yindex);
    }

#ifdef DD_DEBUG
    if (zero) {
        (void) Cudd_DebugCheck(table);
    }
#endif

    return(table->keys - table->isolated);

cuddLinearOutOfMem:
    (void) fprintf(table->err,"Error: cuddLinearInPlace out of memory\n");

    return (0);

}